

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::
     RenderLineSegments<ImPlot::GetterXsYs<unsigned_int>,ImPlot::GetterXsYRef<unsigned_int>,ImPlot::TransformerLinLin>
               (GetterXsYs<unsigned_int> *getter1,GetterXsYRef<unsigned_int> *getter2,
               TransformerLinLin *transformer,ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  ImVec2 IVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  ImPlotPlot *pIVar6;
  undefined1 auVar7 [16];
  ImPlotContext *pIVar8;
  long lVar9;
  ImPlotContext *pIVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_60;
  LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYRef<unsigned_int>,_ImPlot::TransformerLinLin>
  local_58;
  
  pIVar8 = GImPlot;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_58.Prims = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_58.Prims = getter1->Count;
    }
    local_58.Getter1 = getter1;
    local_58.Getter2 = getter2;
    local_58.Transformer = transformer;
    local_58.Col = col;
    local_58.Weight = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_int>,ImPlot::GetterXsYRef<unsigned_int>,ImPlot::TransformerLinLin>>
              (&local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    iVar11 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      iVar11 = getter1->Count;
    }
    if (0 < iVar11) {
      iVar12 = 0;
      pIVar10 = GImPlot;
      do {
        iVar4 = getter1->Count;
        lVar9 = (long)(((getter1->Offset + iVar12) % iVar4 + iVar4) % iVar4) * (long)getter1->Stride
        ;
        iVar4 = transformer->YAxis;
        pIVar6 = pIVar10->CurrentPlot;
        auVar13._4_4_ = 0;
        auVar13._0_4_ = *(uint *)((long)getter1->Xs + lVar9);
        auVar13._8_4_ = *(uint *)((long)getter1->Ys + lVar9);
        auVar13._12_4_ = 0;
        auVar7._8_8_ = 0x4330000000000000;
        auVar7._0_8_ = 0x4330000000000000;
        IVar2 = pIVar10->PixelRange[iVar4].Min;
        dVar3 = (pIVar6->XAxis).Range.Min;
        fVar15 = (float)(pIVar10->Mx * ((SUB168(auVar13 | auVar7,0) - 4503599627370496.0) - dVar3) +
                        (double)IVar2.x);
        fVar16 = (float)(pIVar10->My[iVar4] *
                         ((SUB168(auVar13 | auVar7,8) - 4503599627370496.0) -
                         pIVar6->YAxis[iVar4].Range.Min) + (double)IVar2.y);
        local_58.Getter1 = (GetterXsYs<unsigned_int> *)CONCAT44(fVar16,fVar15);
        iVar5 = getter2->Count;
        IVar2 = pIVar10->PixelRange[iVar4].Min;
        local_60.x = (float)(pIVar10->Mx *
                             ((double)*(uint *)((long)getter2->Xs +
                                               (long)(((getter2->Offset + iVar12) % iVar5 + iVar5) %
                                                     iVar5) * (long)getter2->Stride) - dVar3) +
                            (double)IVar2.x);
        local_60.y = (float)(pIVar10->My[iVar4] * (getter2->YRef - pIVar6->YAxis[iVar4].Range.Min) +
                            (double)IVar2.y);
        pIVar6 = pIVar8->CurrentPlot;
        fVar14 = fVar16;
        if (local_60.y <= fVar16) {
          fVar14 = local_60.y;
        }
        if ((fVar14 < (pIVar6->PlotRect).Max.y) &&
           (fVar14 = (float)(~-(uint)(local_60.y <= fVar16) & (uint)local_60.y |
                            -(uint)(local_60.y <= fVar16) & (uint)fVar16),
           pfVar1 = &(pIVar6->PlotRect).Min.y, *pfVar1 <= fVar14 && fVar14 != *pfVar1)) {
          fVar14 = fVar15;
          if (local_60.x <= fVar15) {
            fVar14 = local_60.x;
          }
          if ((fVar14 < (pIVar6->PlotRect).Max.x) &&
             (fVar14 = (float)(~-(uint)(local_60.x <= fVar15) & (uint)local_60.x |
                              (uint)fVar15 & -(uint)(local_60.x <= fVar15)),
             (pIVar6->PlotRect).Min.x <= fVar14 && fVar14 != (pIVar6->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)&local_58,&local_60,col,line_weight);
            pIVar10 = GImPlot;
          }
        }
        iVar12 = iVar12 + 1;
      } while (iVar11 != iVar12);
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}